

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseGoogleTestFlag(char *arg)

{
  bool bVar1;
  byte bVar2;
  bool value_21;
  string value_20;
  int32_t value_19;
  bool value_18;
  bool value_17;
  int32_t value_16;
  int32_t value_15;
  bool value_14;
  bool value_13;
  bool value_12;
  string value_11;
  bool value_10;
  string value_9;
  string value_8;
  bool value_7;
  bool value_6;
  bool value_5;
  string value_4;
  string value_3;
  bool value_2;
  bool value_1;
  bool value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  string *psVar3;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  undefined1 uVar4;
  char *in_stack_fffffffffffffea0;
  string *this;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  undefined1 uVar5;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 uVar6;
  undefined7 in_stack_fffffffffffffed8;
  string local_110 [36];
  undefined4 local_ec;
  byte local_e6;
  byte local_e5;
  undefined4 local_e4;
  undefined4 local_e0;
  byte local_db;
  byte local_da;
  byte local_d9;
  string local_d8 [39];
  byte local_b1;
  string local_b0 [32];
  string local_90 [37];
  byte local_6b;
  byte local_6a;
  byte local_69;
  string local_68 [32];
  uint local_48;
  string local_38 [37];
  byte local_13;
  byte local_12;
  byte local_11;
  byte local_1;
  
  local_11 = FLAGS_gtest_also_run_disabled_tests & 1;
  bVar1 = ParseFlag((char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                    in_stack_fffffffffffffea0,
                    (bool *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  if (bVar1) {
    FLAGS_gtest_also_run_disabled_tests = local_11 & 1;
    local_1 = 1;
  }
  else {
    local_12 = FLAGS_gtest_break_on_failure & 1;
    bVar1 = ParseFlag((char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                      in_stack_fffffffffffffea0,
                      (bool *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    if (bVar1) {
      FLAGS_gtest_break_on_failure = local_12 & 1;
      local_1 = 1;
    }
    else {
      local_13 = FLAGS_gtest_catch_exceptions & 1;
      bVar1 = ParseFlag((char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                        in_stack_fffffffffffffea0,
                        (bool *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      if (bVar1) {
        FLAGS_gtest_catch_exceptions = local_13 & 1;
        local_1 = 1;
      }
      else {
        std::__cxx11::string::string(local_38,(string *)FLAGS_gtest_color_abi_cxx11_);
        bVar1 = ParseFlag<std::__cxx11::string>
                          ((char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                           in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)FLAGS_gtest_color_abi_cxx11_,local_38);
          local_1 = 1;
        }
        local_48 = (uint)bVar1;
        std::__cxx11::string::~string(local_38);
        if (local_48 == 0) {
          psVar3 = local_68;
          std::__cxx11::string::string(psVar3,(string *)FLAGS_gtest_death_test_style_abi_cxx11_);
          bVar1 = ParseFlag<std::__cxx11::string>
                            ((char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                             in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          uVar4 = bVar1;
          if (bVar1) {
            std::__cxx11::string::operator=
                      ((string *)FLAGS_gtest_death_test_style_abi_cxx11_,local_68);
            local_1 = 1;
          }
          local_48 = (uint)bVar1;
          std::__cxx11::string::~string(local_68);
          if (local_48 == 0) {
            local_69 = FLAGS_gtest_death_test_use_fork & 1;
            bVar1 = ParseFlag((char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0,
                              (bool *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98))
            ;
            if (bVar1) {
              FLAGS_gtest_death_test_use_fork = local_69 & 1;
              local_1 = 1;
            }
            else {
              local_6a = FLAGS_gtest_fail_fast & 1;
              bVar1 = ParseFlag((char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8
                                                ),in_stack_fffffffffffffea0,
                                (bool *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98
                                                ));
              if (bVar1) {
                FLAGS_gtest_fail_fast = local_6a & 1;
                local_1 = 1;
              }
              else {
                local_6b = FLAGS_gtest_fail_if_no_test_linked & 1;
                bVar1 = ParseFlag((char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                   in_stack_fffffffffffffea8),
                                  in_stack_fffffffffffffea0,
                                  (bool *)CONCAT17(in_stack_fffffffffffffe9f,
                                                   in_stack_fffffffffffffe98));
                if (bVar1) {
                  FLAGS_gtest_fail_if_no_test_linked = local_6b & 1;
                  local_1 = 1;
                }
                else {
                  std::__cxx11::string::string(local_90,(string *)FLAGS_gtest_filter_abi_cxx11_);
                  bVar1 = ParseFlag<std::__cxx11::string>
                                    ((char *)CONCAT17(in_stack_fffffffffffffe9f,
                                                      in_stack_fffffffffffffe98),
                                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
                  uVar6 = bVar1;
                  if (bVar1) {
                    std::__cxx11::string::operator=
                              ((string *)FLAGS_gtest_filter_abi_cxx11_,local_90);
                    local_1 = 1;
                  }
                  local_48 = (uint)bVar1;
                  std::__cxx11::string::~string(local_90);
                  if (local_48 == 0) {
                    std::__cxx11::string::string
                              (local_b0,(string *)FLAGS_gtest_internal_run_death_test_abi_cxx11_);
                    bVar1 = ParseFlag<std::__cxx11::string>
                                      ((char *)CONCAT17(in_stack_fffffffffffffe9f,
                                                        in_stack_fffffffffffffe98),
                                       in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
                    if (bVar1) {
                      std::__cxx11::string::operator=
                                ((string *)FLAGS_gtest_internal_run_death_test_abi_cxx11_,local_b0);
                      local_1 = 1;
                    }
                    local_48 = (uint)bVar1;
                    std::__cxx11::string::~string(local_b0);
                    if (local_48 == 0) {
                      local_b1 = FLAGS_gtest_list_tests & 1;
                      bVar1 = ParseFlag((char *)CONCAT17(in_stack_fffffffffffffeaf,
                                                         in_stack_fffffffffffffea8),
                                        in_stack_fffffffffffffea0,
                                        (bool *)CONCAT17(in_stack_fffffffffffffe9f,
                                                         in_stack_fffffffffffffe98));
                      if (bVar1) {
                        FLAGS_gtest_list_tests = local_b1 & 1;
                        local_1 = 1;
                      }
                      else {
                        this = local_d8;
                        std::__cxx11::string::string(this,(string *)FLAGS_gtest_output_abi_cxx11_);
                        bVar1 = ParseFlag<std::__cxx11::string>
                                          ((char *)CONCAT17(in_stack_fffffffffffffe9f,
                                                            in_stack_fffffffffffffe98),
                                           in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
                        uVar5 = bVar1;
                        if (bVar1) {
                          std::__cxx11::string::operator=
                                    ((string *)FLAGS_gtest_output_abi_cxx11_,local_d8);
                          local_1 = 1;
                        }
                        local_48 = (uint)bVar1;
                        std::__cxx11::string::~string(local_d8);
                        if (local_48 == 0) {
                          local_d9 = FLAGS_gtest_brief & 1;
                          bVar1 = ParseFlag((char *)CONCAT17(uVar5,in_stack_fffffffffffffea8),
                                            (char *)this,
                                            (bool *)CONCAT17(in_stack_fffffffffffffe9f,
                                                             in_stack_fffffffffffffe98));
                          if (bVar1) {
                            FLAGS_gtest_brief = local_d9 & 1;
                            local_1 = 1;
                          }
                          else {
                            local_da = FLAGS_gtest_print_time & 1;
                            bVar1 = ParseFlag((char *)CONCAT17(uVar5,in_stack_fffffffffffffea8),
                                              (char *)this,
                                              (bool *)CONCAT17(in_stack_fffffffffffffe9f,
                                                               in_stack_fffffffffffffe98));
                            if (bVar1) {
                              FLAGS_gtest_print_time = local_da & 1;
                              local_1 = 1;
                            }
                            else {
                              local_db = FLAGS_gtest_print_utf8 & 1;
                              bVar1 = ParseFlag((char *)CONCAT17(uVar5,in_stack_fffffffffffffea8),
                                                (char *)this,
                                                (bool *)CONCAT17(in_stack_fffffffffffffe9f,
                                                                 in_stack_fffffffffffffe98));
                              if (bVar1) {
                                FLAGS_gtest_print_utf8 = local_db & 1;
                                local_1 = 1;
                              }
                              else {
                                local_e0 = FLAGS_gtest_random_seed;
                                bVar1 = ParseFlag((char *)CONCAT17(uVar4,in_stack_fffffffffffffed8),
                                                  (char *)psVar3,
                                                  (int32_t *)
                                                  CONCAT17(uVar6,in_stack_fffffffffffffec8));
                                if (bVar1) {
                                  FLAGS_gtest_random_seed = local_e0;
                                  local_1 = 1;
                                }
                                else {
                                  local_e4 = FLAGS_gtest_repeat;
                                  bVar1 = ParseFlag((char *)CONCAT17(uVar4,in_stack_fffffffffffffed8
                                                                    ),(char *)psVar3,
                                                    (int32_t *)
                                                    CONCAT17(uVar6,in_stack_fffffffffffffec8));
                                  if (bVar1) {
                                    FLAGS_gtest_repeat = local_e4;
                                    local_1 = 1;
                                  }
                                  else {
                                    local_e5 = FLAGS_gtest_recreate_environments_when_repeating & 1;
                                    bVar1 = ParseFlag((char *)CONCAT17(uVar5,
                                                  in_stack_fffffffffffffea8),(char *)this,
                                                  (bool *)CONCAT17(in_stack_fffffffffffffe9f,
                                                                   in_stack_fffffffffffffe98));
                                    if (bVar1) {
                                      FLAGS_gtest_recreate_environments_when_repeating =
                                           local_e5 & 1;
                                      local_1 = 1;
                                    }
                                    else {
                                      local_e6 = FLAGS_gtest_shuffle & 1;
                                      bVar1 = ParseFlag((char *)CONCAT17(uVar5,
                                                  in_stack_fffffffffffffea8),(char *)this,
                                                  (bool *)CONCAT17(in_stack_fffffffffffffe9f,
                                                                   in_stack_fffffffffffffe98));
                                      if (bVar1) {
                                        FLAGS_gtest_shuffle = local_e6 & 1;
                                        local_1 = 1;
                                      }
                                      else {
                                        local_ec = FLAGS_gtest_stack_trace_depth;
                                        bVar1 = ParseFlag((char *)CONCAT17(uVar4,
                                                  in_stack_fffffffffffffed8),(char *)psVar3,
                                                  (int32_t *)
                                                  CONCAT17(uVar6,in_stack_fffffffffffffec8));
                                        if (bVar1) {
                                          FLAGS_gtest_stack_trace_depth = local_ec;
                                          local_1 = 1;
                                        }
                                        else {
                                          psVar3 = local_110;
                                          std::__cxx11::string::string
                                                    (psVar3,(string *)
                                                            FLAGS_gtest_stream_result_to_abi_cxx11_)
                                          ;
                                          bVar1 = ParseFlag<std::__cxx11::string>
                                                            ((char *)CONCAT17(
                                                  in_stack_fffffffffffffe9f,
                                                  in_stack_fffffffffffffe98),(char *)psVar3,
                                                  in_stack_fffffffffffffe88);
                                          uVar4 = bVar1;
                                          if (bVar1) {
                                            std::__cxx11::string::operator=
                                                      ((string *)
                                                       FLAGS_gtest_stream_result_to_abi_cxx11_,
                                                       local_110);
                                            local_1 = 1;
                                          }
                                          local_48 = (uint)bVar1;
                                          std::__cxx11::string::~string(local_110);
                                          if (local_48 == 0) {
                                            bVar2 = FLAGS_gtest_throw_on_failure & 1;
                                            bVar1 = ParseFlag((char *)CONCAT17(uVar5,
                                                  in_stack_fffffffffffffea8),(char *)this,
                                                  (bool *)CONCAT17(uVar4,in_stack_fffffffffffffe98))
                                            ;
                                            if (bVar1) {
                                              local_1 = 1;
                                              FLAGS_gtest_throw_on_failure = bVar2;
                                            }
                                            else {
                                              local_1 = 0;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

static bool ParseGoogleTestFlag(const char* const arg) {
#define GTEST_INTERNAL_PARSE_FLAG(flag_name)  \
  do {                                        \
    auto value = GTEST_FLAG_GET(flag_name);   \
    if (ParseFlag(arg, #flag_name, &value)) { \
      GTEST_FLAG_SET(flag_name, value);       \
      return true;                            \
    }                                         \
  } while (false)

  GTEST_INTERNAL_PARSE_FLAG(also_run_disabled_tests);
  GTEST_INTERNAL_PARSE_FLAG(break_on_failure);
  GTEST_INTERNAL_PARSE_FLAG(catch_exceptions);
  GTEST_INTERNAL_PARSE_FLAG(color);
  GTEST_INTERNAL_PARSE_FLAG(death_test_style);
  GTEST_INTERNAL_PARSE_FLAG(death_test_use_fork);
  GTEST_INTERNAL_PARSE_FLAG(fail_fast);
  GTEST_INTERNAL_PARSE_FLAG(fail_if_no_test_linked);
  GTEST_INTERNAL_PARSE_FLAG(filter);
  GTEST_INTERNAL_PARSE_FLAG(internal_run_death_test);
  GTEST_INTERNAL_PARSE_FLAG(list_tests);
  GTEST_INTERNAL_PARSE_FLAG(output);
  GTEST_INTERNAL_PARSE_FLAG(brief);
  GTEST_INTERNAL_PARSE_FLAG(print_time);
  GTEST_INTERNAL_PARSE_FLAG(print_utf8);
  GTEST_INTERNAL_PARSE_FLAG(random_seed);
  GTEST_INTERNAL_PARSE_FLAG(repeat);
  GTEST_INTERNAL_PARSE_FLAG(recreate_environments_when_repeating);
  GTEST_INTERNAL_PARSE_FLAG(shuffle);
  GTEST_INTERNAL_PARSE_FLAG(stack_trace_depth);
  GTEST_INTERNAL_PARSE_FLAG(stream_result_to);
  GTEST_INTERNAL_PARSE_FLAG(throw_on_failure);
  return false;
}